

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QList<QDockWidget_*> * allMyDockWidgets(QWidget *mainWindow)

{
  bool bVar1;
  QDockWidget *pQVar2;
  QDockWidgetGroupWindow *pQVar3;
  const_iterator o;
  parameter_type in_RDI;
  long in_FS_OFFSET;
  QDockWidget *dw_1;
  QObject *c_1;
  QObjectList *__range4;
  QDockWidgetGroupWindow *gw;
  QDockWidget *dw;
  QObject *c;
  QObjectList *__range1;
  QList<QDockWidget_*> *result;
  const_iterator __end4;
  const_iterator __begin4;
  const_iterator __end1;
  const_iterator __begin1;
  parameter_type this;
  const_iterator local_28;
  QObject **local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&in_RDI->super_QWidget = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(in_RDI->super_QWidget).field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(in_RDI->super_QWidget).super_QPaintDevice = &DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QList<QDockWidget_*>::QList((QList<QDockWidget_*> *)0x5f5018);
  QObject::children((QObject *)0x5f5031);
  local_10.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QObject_*>::begin((QList<QObject_*> *)this);
  local_18.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = QList<QObject_*>::end((QList<QObject_*> *)this);
  while( true ) {
    local_20 = local_18.i;
    bVar1 = QList<QObject_*>::const_iterator::operator!=(&local_10,local_18);
    if (!bVar1) break;
    QList<QObject_*>::const_iterator::operator*(&local_10);
    pQVar2 = qobject_cast<QDockWidget*>((QObject *)0x5f50bf);
    if (pQVar2 == (QDockWidget *)0x0) {
      pQVar3 = qobject_cast<QDockWidgetGroupWindow*>((QObject *)0x5f50e9);
      if (pQVar3 != (QDockWidgetGroupWindow *)0x0) {
        QObject::children((QObject *)0x5f5113);
        local_28.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
        local_28 = QList<QObject_*>::begin((QList<QObject_*> *)this);
        o = QList<QObject_*>::end((QList<QObject_*> *)this);
        while (bVar1 = QList<QObject_*>::const_iterator::operator!=(&local_28,o), bVar1) {
          QList<QObject_*>::const_iterator::operator*(&local_28);
          pQVar2 = qobject_cast<QDockWidget*>((QObject *)0x5f5189);
          if (pQVar2 != (QDockWidget *)0x0) {
            QList<QDockWidget_*>::append((QList<QDockWidget_*> *)0x5f51a4,in_RDI);
          }
          QList<QObject_*>::const_iterator::operator++(&local_28);
        }
      }
    }
    else {
      QList<QDockWidget_*>::append((QList<QDockWidget_*> *)0x5f50da,in_RDI);
    }
    QList<QObject_*>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QList<QDockWidget_*> *)this;
  }
  __stack_chk_fail();
}

Assistant:

static QList<QDockWidget*> allMyDockWidgets(const QWidget *mainWindow)
{
    QList<QDockWidget*> result;
    for (QObject *c : mainWindow->children()) {
        if (auto *dw = qobject_cast<QDockWidget*>(c)) {
            result.append(dw);
        } else if (auto *gw = qobject_cast<QDockWidgetGroupWindow*>(c)) {
            for (QObject *c : gw->children()) {
                if (auto *dw = qobject_cast<QDockWidget*>(c))
                    result.append(dw);
            }
        }
    }

    return result;
}